

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdnewpfor.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
FastPForLib::SIMDNewPFor<4u,FastPForLib::Simple16<false>>::name_abi_cxx11_
          (SIMDNewPFor<4U,_FastPForLib::Simple16<false>_> *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_c0 [8];
  undefined4 in_stack_ffffffffffffff48;
  uint in_stack_ffffffffffffff4c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  string local_30 [48];
  
  __lhs = in_RDI;
  std::__cxx11::to_string(in_stack_ffffffffffffff4c);
  std::operator+((char *)__lhs,in_RDI);
  std::operator+(__lhs,(char *)in_RDI);
  Simple16<false>::name_abi_cxx11_
            ((Simple16<false> *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  std::operator+(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  std::operator+(__lhs,(char *)in_RDI);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_90);
  return __lhs;
}

Assistant:

virtual std::string name() const {
    return "SIMDNewPFor<" + std::to_string(BlockSizeInUnitsOfPackSize) + ","
           + ecoder.name() + ">";
  }